

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataTemplatedGather<long>
               (TupleDataLayout *layout,Vector *row_locations,idx_t col_idx,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> param_8,
               vector<duckdb::TupleDataGatherFunction,_true> *param_9)

{
  value_type vVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  const_reference pvVar6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  data_ptr_t pdVar10;
  data_ptr_t pdVar11;
  ulong uVar12;
  ulong uVar13;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  buffer_ptr<ValidityBuffer> *local_58;
  data_ptr_t local_50;
  data_ptr_t local_48;
  SelectionVector *local_40;
  idx_t local_38;
  
  pdVar10 = row_locations->data;
  pdVar11 = target->data;
  FlatVector::VerifyFlatVector(target);
  pvVar6 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_idx);
  if (scan_count != 0) {
    vVar1 = *pvVar6;
    local_58 = &(target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar12 = 0;
    local_50 = pdVar11;
    local_48 = pdVar10;
    local_40 = scan_sel;
    do {
      uVar7 = uVar12;
      if (scan_sel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)scan_sel->sel_vector[uVar12];
      }
      uVar13 = uVar12;
      if (target_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)target_sel->sel_vector[uVar12];
      }
      lVar2 = *(long *)(pdVar10 + uVar7 * 8);
      *(undefined8 *)(pdVar11 + uVar13 * 8) = *(undefined8 *)(lVar2 + vVar1);
      if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar2 + (col_idx >> 3))) == 0) {
        _Var9._M_head_impl =
             (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (target->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_38);
          p_Var5 = p_Stack_60;
          peVar4 = local_68;
          local_68 = (element_type *)0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_58);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var9._M_head_impl;
          scan_sel = local_40;
          pdVar10 = local_48;
          pdVar11 = local_50;
        }
        bVar3 = (byte)uVar13 & 0x3f;
        _Var9._M_head_impl[uVar13 >> 6] =
             _Var9._M_head_impl[uVar13 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar12 = uVar12 + 1;
    } while (scan_count != uVar12);
  }
  return;
}

Assistant:

static void TupleDataTemplatedGather(const TupleDataLayout &layout, Vector &row_locations, const idx_t col_idx,
                                     const SelectionVector &scan_sel, const idx_t scan_count, Vector &target,
                                     const SelectionVector &target_sel, optional_ptr<Vector>,
                                     const vector<TupleDataGatherFunction> &) {
	// Source
	const auto source_locations = FlatVector::GetData<data_ptr_t>(row_locations);

	// Target
	auto target_data = FlatVector::GetData<T>(target);
	auto &target_validity = FlatVector::Validity(target);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	for (idx_t i = 0; i < scan_count; i++) {
		const auto &source_row = source_locations[scan_sel.get_index(i)];
		const auto target_idx = target_sel.get_index(i);
		target_data[target_idx] = Load<T>(source_row + offset_in_row);
		ValidityBytes row_mask(source_row, layout.ColumnCount());
		if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
			target_validity.SetInvalid(target_idx);
		}
#ifdef DEBUG
		else {
			TupleDataValueVerify<T>(target.GetType(), target_data[target_idx]);
		}
#endif
	}
}